

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanBackUTF8
          (UnicodeSetStringSpan *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  UnicodeSet *this_00;
  byte bVar1;
  byte bVar2;
  uint8_t *puVar3;
  int32_t *piVar4;
  UBool *pUVar5;
  UBool UVar6;
  uint length_00;
  uint uVar7;
  int32_t iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int32_t oldPos;
  uint uVar14;
  uint8_t *puVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  uint local_dc;
  byte *local_d8;
  OffsetList offsets;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    iVar8 = spanNotBackUTF8(this,s,length);
    return iVar8;
  }
  this_00 = &this->spanSet;
  length_00 = UnicodeSet::spanBackUTF8(this_00,(char *)s,length,USET_SPAN_CONTAINED);
  if (length_00 == 0) {
    uVar7 = 0;
  }
  else {
    offsets.list = offsets.staticList;
    offsets.capacity = 0;
    offsets.length = 0;
    offsets.start = 0;
    if (spanCondition == USET_SPAN_CONTAINED) {
      OffsetList::setMaxLength(&offsets,this->maxLength8);
    }
    local_dc = length - length_00;
    uVar7 = this->strings->count;
    lVar12 = 0;
    if (this->all != '\0') {
      lVar12 = (long)(int)uVar7 * 3;
    }
    puVar3 = this->spanLengths;
    uVar11 = 0;
    if (0 < (int)uVar7) {
      uVar11 = (ulong)uVar7;
    }
LAB_00180edd:
    do {
      local_d8 = this->utf8;
      lVar16 = (long)(int)length_00;
      if (spanCondition == USET_SPAN_CONTAINED) {
        for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
          iVar10 = this->utf8Lengths[uVar17];
          lVar18 = (long)iVar10;
          if (lVar18 != 0) {
            bVar1 = puVar3[uVar17 + lVar12];
            uVar7 = (uint)bVar1;
            if (bVar1 == 0xff) {
              local_d8 = local_d8 + lVar18;
            }
            else {
              if (bVar1 == 0xfe) {
                uVar7 = 0xffffffff;
                if ((iVar10 != 1) && (bVar1 = *local_d8, 0xcc < (byte)(bVar1 + 0xb))) {
                  bVar2 = local_d8[1];
                  if ((bVar1 & 0xf0) == 0xe0) {
                    if ((((byte)" 000000000000\x1000"[bVar1 & 0xf] >> (bVar2 >> 5) & 1) != 0) &&
                       (uVar7 = 0xfffffffe, iVar10 != 2)) {
                      uVar7 = (-0x41 < (char)local_d8[2]) - 3;
                    }
                  }
                  else if (bVar1 < 0xe0) {
                    uVar7 = ~(uint)((char)bVar2 < -0x40);
                  }
                  else if ((((((byte)""[bVar2 >> 4] >> (bVar1 & 7) & 1) != 0) &&
                            (uVar7 = 0xfffffffe, iVar10 != 2)) &&
                           (uVar7 = 0xfffffffe, (char)local_d8[2] < -0x40)) &&
                          (uVar7 = 0xfffffffd, iVar10 != 3)) {
                    uVar7 = (char)local_d8[3] < -0x40 ^ 0xfffffffd;
                  }
                }
                uVar7 = uVar7 + iVar10;
              }
              uVar14 = local_dc;
              if ((int)uVar7 < (int)local_dc) {
                uVar14 = uVar7;
              }
              lVar19 = (long)(int)(iVar10 - uVar14);
              puVar15 = s + (lVar16 - lVar19);
              if ((int)local_dc <= (int)uVar7) {
                uVar7 = local_dc;
              }
              for (lVar13 = 0; pUVar5 = offsets.list, lVar19 + lVar13 <= lVar16; lVar13 = lVar13 + 1
                  ) {
                if (-0x41 < (char)*puVar15) {
                  iVar9 = (iVar10 - uVar14) + (uint)lVar13;
                  iVar8 = offsets.capacity;
                  if (iVar9 + offsets.start < offsets.capacity) {
                    iVar8 = 0;
                  }
                  iVar9 = (offsets.start - iVar8) + iVar9;
                  if ((offsets.list[iVar9] == '\0') &&
                     (UVar6 = matches8(puVar15,local_d8,iVar10), UVar6 != '\0')) {
                    if ((lVar19 - lVar16) + lVar13 == 0) goto LAB_001812ed;
                    pUVar5[iVar9] = '\x01';
                    offsets.length = offsets.length + 1;
                  }
                }
                if (uVar7 == (uint)lVar13) break;
                puVar15 = puVar15 + -1;
              }
              local_d8 = local_d8 + lVar18;
            }
          }
        }
LAB_00181220:
        if (length_00 == length || local_dc != 0) {
          uVar7 = length_00;
          if (offsets.length == 0) break;
        }
        else {
          if (offsets.length == 0) {
            uVar7 = UnicodeSet::spanBackUTF8(this_00,(char *)s,length_00,USET_SPAN_CONTAINED);
            if (uVar7 != 0) {
              local_dc = length_00 - uVar7;
              length_00 = uVar7;
              uVar14 = local_dc;
              goto joined_r0x001812c9;
            }
            break;
          }
          iVar8 = spanOneBackUTF8(this_00,s,length_00);
          if (0 < iVar8) {
            length_00 = length_00 - iVar8;
            if (length_00 == 0) {
LAB_001812ed:
              uVar7 = 0;
              break;
            }
            OffsetList::shift(&offsets,iVar8);
            local_dc = 0;
            goto LAB_00180edd;
          }
        }
        iVar8 = OffsetList::popMinimum(&offsets);
        length_00 = length_00 - iVar8;
        local_dc = 0;
        goto LAB_00180edd;
      }
      piVar4 = this->utf8Lengths;
      iVar10 = 0;
      uVar7 = 0;
      for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
        uVar14 = piVar4[uVar17];
        if ((long)(int)uVar14 != 0) {
          uVar20 = (uint)puVar3[uVar17 + lVar12];
          if (0xfd < uVar20) {
            uVar20 = uVar14;
          }
          if ((int)local_dc <= (int)uVar20) {
            uVar20 = local_dc;
          }
          lVar18 = (long)(int)(uVar14 - uVar20);
          puVar15 = s + (lVar16 - lVar18);
          while( true ) {
            if ((lVar16 < lVar18) || ((int)uVar20 < (int)uVar7)) goto LAB_001811f1;
            if ((-0x41 < (char)*puVar15) &&
               ((((int)uVar7 < (int)uVar20 || (iVar10 < lVar18)) &&
                (UVar6 = matches8(puVar15,local_d8,uVar14), UVar6 != '\0')))) break;
            uVar20 = uVar20 - 1;
            lVar18 = lVar18 + 1;
            puVar15 = puVar15 + -1;
          }
          iVar10 = uVar14 - uVar20;
          uVar7 = uVar20;
LAB_001811f1:
          local_d8 = local_d8 + (int)uVar14;
        }
      }
      if (uVar7 == 0 && iVar10 == 0) goto LAB_00181220;
      local_dc = 0;
      uVar7 = 0;
      length_00 = length_00 - iVar10;
      uVar14 = length_00;
joined_r0x001812c9:
    } while (uVar14 != 0);
    OffsetList::~OffsetList(&offsets);
  }
  return uVar7;
}

Assistant:

int32_t UnicodeSetStringSpan::spanBackUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNotBackUTF8(s, length);
    }
    int32_t pos=spanSet.spanBackUTF8((const char *)s, length, USET_SPAN_CONTAINED);
    if(pos==0) {
        return 0;
    }
    int32_t spanLength=length-pos;

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength8);
    }
    int32_t i, stringsLength=strings.size();
    uint8_t *spanBackUTF8Lengths=spanLengths;
    if(all) {
        spanBackUTF8Lengths+=3*stringsLength;
    }
    for(;;) {
        const uint8_t *s8=utf8;
        int32_t length8;
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanBackUTF8Lengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    s8+=length8;
                    continue;  // Irrelevant string.
                }

                // Try to match this string at pos-(length8-overlap)..pos-length8.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // While contained: No point matching fully inside the code point span.
                    int32_t len1=0;
                    U8_FWD_1(s8, len1, overlap);
                    overlap-=len1;  // Length of the string minus the first code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length8-overlap;  // Keep dec+overlap==length8.
                for(;;) {
                    if(dec>pos) {
                        break;
                    }
                    // Try to match if the decrement is not listed already.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if( !U8_IS_TRAIL(s[pos-dec]) &&
                        !offsets.containsOffset(dec) &&
                        matches8(s+pos-dec, s8, length8)
                    ) {
                        if(dec==pos) {
                            return 0;  // Reached the start of the string.
                        }
                        offsets.addOffset(dec);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++dec;
                }
                s8+=length8;
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxDec=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanBackUTF8Lengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the latest end.

                // Try to match this string at pos-(length8-overlap)..pos-length8.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the latest end.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length8-overlap;  // Keep dec+overlap==length8.
                for(;;) {
                    if(dec>pos || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or ends later.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if( !U8_IS_TRAIL(s[pos-dec]) &&
                        (overlap>maxOverlap || /* redundant overlap==maxOverlap && */ dec>maxDec) &&
                        matches8(s+pos-dec, s8, length8)
                    ) {
                        maxDec=dec;  // Longest match from latest end.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++dec;
                }
                s8+=length8;
            }

            if(maxDec!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue before it.
                pos-=maxDec;
                if(pos==0) {
                    return 0;  // Reached the start of the string.
                }
                spanLength=0;  // Match strings from before a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==length) {
            // The position is before an unlimited code point span (spanLength!=0),
            // not before a string match.
            // The only position where spanLength==0 before a span is pos==length.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched before a span.
            }
            // Match strings from before the next string match.
        } else {
            // The position is before a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched before a previous string match.
                // Try another code point span from before the last string match.
                int32_t oldPos=pos;
                pos=spanSet.spanBackUTF8((const char *)s, oldPos, USET_SPAN_CONTAINED);
                spanLength=oldPos-pos;
                if( pos==0 ||           // Reached the start of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos;
                }
                continue;  // spanLength>0: Match strings from before a span.
            } else {
                // Try to match only one code point from before a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOneBackUTF8(spanSet, s, pos);
                if(spanLength>0) {
                    if(spanLength==pos) {
                        return 0;  // Reached the start of the string.
                    }
                    // Match strings before this code point.
                    // There cannot be any decrements below it because UnicodeSet strings
                    // contain multiple code points.
                    pos-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from before a single code point.
                }
                // Match strings from before the next string match.
            }
        }
        pos-=offsets.popMinimum();
        spanLength=0;  // Match strings from before a string match.
    }
}